

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::drawBackground(QGraphicsScene *this,QPainter *painter,QRectF *rect)

{
  BrushStyle BVar1;
  QGraphicsScenePrivate *this_00;
  QBrush *in_RDX;
  QRectF *in_RSI;
  QGraphicsScene *in_RDI;
  long in_FS_OFFSET;
  QGraphicsScenePrivate *d;
  QBrush local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsScene *)0x9d3854);
  BVar1 = QBrush::style((QBrush *)0x9d386a);
  if (BVar1 != NoBrush) {
    if ((*(uint *)&this_00->field_0xb8 >> 0xe & 1) != 0) {
      QPainter::save();
    }
    QPainter::setBrushOrigin((QPainter *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    backgroundBrush(in_RDI);
    QPainter::fillRect(in_RSI,in_RDX);
    QBrush::~QBrush(local_10);
    if ((*(uint *)&this_00->field_0xb8 >> 0xe & 1) != 0) {
      QPainter::restore();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::drawBackground(QPainter *painter, const QRectF &rect)
{
    Q_D(QGraphicsScene);

    if (d->backgroundBrush.style() != Qt::NoBrush) {
        if (d->painterStateProtection)
            painter->save();
        painter->setBrushOrigin(0, 0);
        painter->fillRect(rect, backgroundBrush());
        if (d->painterStateProtection)
            painter->restore();
    }
}